

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::jacobiEigenSolver<float>
               (Matrix33<float> *A,Vec3<float> *S,Matrix33<float> *V,float tol)

{
  float fVar1;
  float fVar2;
  undefined1 uVar3;
  bool bVar4;
  float *pfVar5;
  Matrix33<float> *in_RDX;
  Vec3<float> *in_RSI;
  Matrix33<float> *in_RDI;
  float in_XMM0_Da;
  BaseType BVar6;
  float unaff_retaddr;
  Vec3<float> *in_stack_00000008;
  Matrix33<float> *in_stack_00000010;
  int i_1;
  bool changed;
  Vec3<float> Z;
  int numIter;
  float absTol;
  int maxIter;
  int i;
  bool local_55;
  undefined1 local_4a;
  undefined1 local_49;
  undefined4 in_stack_ffffffffffffffc0;
  int i_00;
  undefined3 uVar7;
  uint in_stack_ffffffffffffffc4;
  uint uVar8;
  Vec3<float> local_38;
  int local_2c;
  float local_28;
  undefined4 local_24;
  int local_20;
  float local_1c;
  Vec3<float> *local_10;
  Matrix33<float> *local_8;
  
  local_1c = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Matrix33<float>::makeIdentity(in_RDX);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    pfVar5 = Matrix33<float>::operator[](local_8,local_20);
    fVar1 = pfVar5[local_20];
    pfVar5 = Vec3<float>::operator[](local_10,local_20);
    *pfVar5 = fVar1;
  }
  local_24 = 0x14;
  BVar6 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix33<float>>
                    ((Matrix33<float> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  local_28 = local_1c * BVar6;
  if ((local_28 != 0.0) || (NAN(local_28))) {
    local_2c = 0;
    do {
      Vec3<float>::Vec3(&local_38,0.0,0.0,0.0);
      local_2c = local_2c + 1;
      uVar3 = (anonymous_namespace)::jacobiRotation<0,1,2,float>
                        (_i_1,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      uVar7 = (undefined3)in_stack_ffffffffffffffc4;
      bVar4 = (anonymous_namespace)::jacobiRotation<0,2,1,float>
                        (_i_1,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      local_49 = 1;
      if (!bVar4) {
        local_49 = uVar3;
      }
      uVar8 = CONCAT13(local_49,uVar7) & 0x1ffffff;
      bVar4 = (anonymous_namespace)::jacobiRotation<1,2,0,float>
                        (_i_1,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      local_4a = 1;
      if (!bVar4) {
        local_4a = (undefined1)(uVar8 >> 0x18);
      }
      in_stack_ffffffffffffffc4 = CONCAT13(local_4a,(int3)uVar8) & 0x1ffffff;
      for (i_00 = 0; i_00 < 3; i_00 = i_00 + 1) {
        pfVar5 = Vec3<float>::operator[](&local_38,i_00);
        fVar1 = *pfVar5;
        pfVar5 = Vec3<float>::operator[](local_10,i_00);
        fVar2 = *pfVar5;
        *pfVar5 = fVar1 + fVar2;
        pfVar5 = Matrix33<float>::operator[](local_8,i_00);
        pfVar5[i_00] = fVar1 + fVar2;
      }
      if ((in_stack_ffffffffffffffc4 & 0x1000000) == 0) {
        return;
      }
      BVar6 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix33<float>>
                        ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffffc4,i_00));
      local_55 = local_28 < BVar6 && local_2c < 0x14;
    } while (local_55);
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix33<T>& A, Vec3<T>& S, Matrix33<T>& V, const T tol)
{
    V.makeIdentity ();
    for (int i = 0; i < 3; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            // Z is for accumulating small changes (h) to diagonal entries
            // of A for one sweep. Adding h's directly to A might cause
            // a cancellation effect when h is relatively very small to
            // the corresponding diagonal entry of A and
            // this will increase numerical errors
            Vec3<T> Z (0, 0, 0);
            ++numIter;
            bool changed = jacobiRotation<0, 1, 2> (A, V, Z, tol);
            changed      = jacobiRotation<0, 2, 1> (A, V, Z, tol) || changed;
            changed      = jacobiRotation<1, 2, 0> (A, V, Z, tol) || changed;
            // One sweep passed. Add accumulated changes (Z) to singular values (S)
            // Update diagonal elements of A for better accuracy as well.
            for (int i = 0; i < 3; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}